

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<true,true>
          (Scanner<UTF8EncodingPolicyBase<false>> *this,OLECHAR delim,EncodedCharPtr *pp)

{
  Token *this_00;
  code *pcVar1;
  bool bVar2;
  OLECHAR OVar3;
  BOOL BVar4;
  uint uVar5;
  int iVar6;
  undefined4 *puVar7;
  HashTbl *this_01;
  IdentPtr pid;
  char16 local_4a;
  HRESULT local_48;
  bool createPid;
  uint uStack_44;
  OLECHAR lower;
  uint errorType;
  codepoint_t codePoint;
  EncodedCharPtr last;
  EncodedCharPtr p;
  OLECHAR local_26;
  int wT;
  OLECHAR rawch;
  OLECHAR c;
  EncodedCharPtr *ppuStack_20;
  OLECHAR ch;
  EncodedCharPtr *pp_local;
  Scanner<UTF8EncodingPolicyBase<false>> *pSStack_10;
  OLECHAR delim_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  last = *pp;
  _errorType = *(EncodedCharPtr *)(this + 0x4c8);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xfb);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xf7);
  ppuStack_20 = pp;
  pp_local._6_2_ = delim;
  pSStack_10 = this;
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::Reset((TemporaryBuffer *)(this + 0x510))
  ;
  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::Reset((TemporaryBuffer *)(this + 0x628))
  ;
LAB_015f27e1:
  do {
    local_26 = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
    wT._2_2_ = local_26;
    if (local_26 == L'\0') {
      if (_errorType < last) {
        *(EncodedCharPtr *)(this + 0x4e0) = last + -1;
        Scanner<UTF8EncodingPolicyBase<false>_>::Error
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,-0x7ff5fc09);
      }
      goto LAB_015f2f53;
    }
    if (local_26 == L'\n') {
LAB_015f288a:
      local_26 = wT._2_2_;
      Scanner<UTF8EncodingPolicyBase<false>_>::NotifyScannedNewLine
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)this);
      *(EncodedCharPtr *)(this + 0x4d0) = last;
    }
    else {
      if (local_26 == L'\r') {
        OVar3 = UTF8EncodingPolicyBase<false>::PeekFirst(last,_errorType);
        if (OVar3 == L'\n') {
          UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
        }
        wT._2_2_ = L'\n';
        goto LAB_015f288a;
      }
      if (local_26 == L'\"') {
LAB_015f28a7:
        if (local_26 == pp_local._6_2_) {
LAB_015f2f80:
          bVar2 = true;
          if (((((byte)this[0x508] >> 6 & 1) != 0) && (bVar2 = false, *(int *)(this + 0x51c) == 10))
             && (iVar6 = memcmp(L"use strict",*(void **)(this + 0x520),
                                (ulong)*(uint *)(this + 0x51c) << 1), iVar6 == 0)) {
            bVar2 = true;
          }
          if (bVar2) {
            this_00 = *(Token **)(this + 0x4b8);
            this_01 = Scanner<UTF8EncodingPolicyBase<false>_>::GetHashTbl
                                ((Scanner<UTF8EncodingPolicyBase<false>_> *)this);
            pid = HashTbl::PidHashNameLen<char16_t>
                            (this_01,*(char16_t **)(this + 0x520),*(uint32 *)(this + 0x51c));
            Token::SetIdentifier(this_00,pid);
          }
          else {
            Token::SetIdentifier(*(Token **)(this + 0x4b8),(IdentPtr)0x0);
          }
          *(undefined4 *)(this + 0x744) = 0;
          this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)
                        ((byte)this[0x508] & 0xfd | (pp_local._6_2_ == L'\"') << 1);
          *ppuStack_20 = last;
          return tkStrCon;
        }
      }
      else if (local_26 == L'$') {
        OVar3 = UTF8EncodingPolicyBase<false>::PeekFirst(last,_errorType);
        if (OVar3 == L'{') {
          last = last + -1;
          goto LAB_015f2f80;
        }
LAB_015f2924:
        BVar4 = UTF8EncodingPolicyBase<false>::IsMultiUnitChar(wT._2_2_);
        if (BVar4 != 0) {
          local_26 = UTF8EncodingPolicyBase<false>::ReadRest<true>
                               ((UTF8EncodingPolicyBase<false> *)(this + 8),wT._2_2_,&last,
                                _errorType);
          wT._2_2_ = local_26;
        }
      }
      else {
        if (local_26 == L'\'') goto LAB_015f28a7;
        if (local_26 != L'\\') {
          if (local_26 == L'`') {
            last = last + -1;
            goto LAB_015f2f80;
          }
          goto LAB_015f2924;
        }
        Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                  ((TemporaryBuffer *)(this + 0x628),0x5c);
        this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] | 8);
        local_26 = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
        uStack_44 = 0;
        local_48 = -0x7ff5fc01;
        uVar5 = (uint)(ushort)local_26;
        wT._2_2_ = local_26;
        if (uVar5 != 0) {
          if (uVar5 != 10) {
            if (uVar5 != 0xd) {
              if (uVar5 - 0x30 < 4) {
                wT._2_2_ = local_26 + L'￐';
                wT._0_2_ = UTF8EncodingPolicyBase<false>::PeekFirst(last,_errorType);
                if ((wT._2_2_ != L'\0') ||
                   ((0x2f < (ushort)(OLECHAR)wT && ((ushort)(OLECHAR)wT < 0x38)))) {
                  local_48 = -0x7ff5fbf1;
                  goto LAB_015f2ee6;
                }
              }
              else {
                if (uVar5 - 0x34 < 4) {
                  local_48 = -0x7ff5fbf1;
                  goto LAB_015f2ee6;
                }
                if (uVar5 == 0x62) {
                  wT._2_2_ = L'\b';
                }
                else if (uVar5 == 0x66) {
                  wT._2_2_ = L'\f';
                }
                else if (uVar5 == 0x6e) {
                  wT._2_2_ = L'\n';
                }
                else if (uVar5 == 0x72) {
                  wT._2_2_ = L'\r';
                }
                else if (uVar5 == 0x74) {
                  wT._2_2_ = L'\t';
                }
                else if (uVar5 == 0x75) {
                  Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                            ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)local_26);
                  wT._2_2_ = L'\0';
                  wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
                  BVar4 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
                  if (BVar4 == 0) {
                    if (((OLECHAR)wT != L'{') || (((byte)this[0x509] & 1) == 0)) goto LAB_015f2ee6;
                    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                              ((TemporaryBuffer *)(this + 0x628),0x7b);
                    wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
                    BVar4 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
                    if (BVar4 == 0) goto LAB_015f2ee6;
                    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                              ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)(OLECHAR)wT);
                    uStack_44 = p._4_4_;
                    while( true ) {
                      wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
                      BVar4 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
                      if (BVar4 == 0) break;
                      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                                ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)(OLECHAR)wT);
                      uStack_44 = p._4_4_ + uStack_44 * 0x10;
                      if (0x10ffff < uStack_44) {
                        local_48 = -0x7ff5fbd9;
                        goto LAB_015f2ee6;
                      }
                    }
                    if ((OLECHAR)wT != L'}') {
                      local_48 = -0x7ff5fbd8;
                      goto LAB_015f2ee6;
                    }
                    if (0x10ffff < uStack_44) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar7 = 1;
                      bVar2 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                                         ,0x4bd,"(codePoint <= 0x10FFFF)","codePoint <= 0x10FFFF");
                      if (!bVar2) {
                        pcVar1 = (code *)invalidInstructionException();
                        (*pcVar1)();
                      }
                      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar7 = 0;
                    }
                    if (uStack_44 < 0x10000) {
                      wT._2_2_ = (OLECHAR)uStack_44;
                    }
                    else {
                      local_4a = L'\0';
                      Js::NumberUtilities::CodePointAsSurrogatePair
                                (uStack_44,&local_4a,(char16 *)((long)&wT + 2));
                      Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh
                                ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)local_4a);
                    }
                    local_26 = (OLECHAR)wT;
                  }
                  else {
                    uStack_44 = 0;
                    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                              ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)(OLECHAR)wT);
                    uStack_44 = p._4_4_ * 0x1000 + uStack_44;
                    wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
                    BVar4 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
                    if (BVar4 == 0) goto LAB_015f2ee6;
                    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                              ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)(OLECHAR)wT);
                    uStack_44 = p._4_4_ * 0x100 + uStack_44;
LAB_015f2d91:
                    wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
                    BVar4 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
                    if (BVar4 == 0) {
LAB_015f2ee6:
                      *(EncodedCharPtr *)(this + 0x4e0) = last + -1;
                      Scanner<UTF8EncodingPolicyBase<false>_>::Error
                                ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,local_48);
                    }
                    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                              ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)(OLECHAR)wT);
                    uStack_44 = p._4_4_ * 0x10 + uStack_44;
                    wT._0_2_ = UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
                    BVar4 = Js::NumberUtilities::FHexDigit((OLECHAR)wT,(int *)((long)&p + 4));
                    if (BVar4 == 0) goto LAB_015f2ee6;
                    uStack_44 = p._4_4_ + uStack_44;
                    local_26 = (OLECHAR)wT;
                    if (0xffff < uStack_44) goto LAB_015f2ee6;
                    wT._2_2_ = (OLECHAR)uStack_44;
                  }
                }
                else if (uVar5 == 0x76) {
                  wT._2_2_ = L'\v';
                }
                else {
                  if (uVar5 == 0x78) {
                    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                              ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)local_26);
                    wT._2_2_ = L'\0';
                    goto LAB_015f2d91;
                  }
                  if ((uVar5 - 0x2028 < 2) ||
                     ((BVar4 = UTF8EncodingPolicyBase<false>::IsMultiUnitChar(local_26), BVar4 != 0
                      && (local_26 = UTF8EncodingPolicyBase<false>::ReadRest<true>
                                               ((UTF8EncodingPolicyBase<false> *)(this + 8),wT._2_2_
                                                ,&last,_errorType), wT._2_2_ = local_26,
                         local_26 == L'\x2028' || local_26 == L'\x2029')))) goto LAB_015f2ea4;
                }
              }
              goto LAB_015f2f53;
            }
            OVar3 = UTF8EncodingPolicyBase<false>::PeekFirst(last,_errorType);
            if (OVar3 == L'\n') {
              UTF8EncodingPolicyBase<false>::ReadFirst(&last,_errorType);
            }
            local_26 = L'\n';
          }
LAB_015f2ea4:
          Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                    ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)local_26);
          Scanner<UTF8EncodingPolicyBase<false>_>::NotifyScannedNewLine
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)this);
          *(EncodedCharPtr *)(this + 0x4d0) = last;
          goto LAB_015f27e1;
        }
        if (_errorType <= last) {
          local_48 = -0x7ff5fc09;
          goto LAB_015f2ee6;
        }
        local_26 = L'0';
      }
    }
LAB_015f2f53:
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh
              ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)wT._2_2_);
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
              ((TemporaryBuffer *)(this + 0x628),(uint)(ushort)local_26);
  } while( true );
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringConstant(OLECHAR delim, EncodedCharPtr *pp)
{
    static_assert((stringTemplateMode && createRawString) || (!stringTemplateMode && !createRawString), "stringTemplateMode and createRawString must have the same value");

    OLECHAR ch, c, rawch;
    int wT;
    EncodedCharPtr p = *pp;
    EncodedCharPtr last = m_pchLast;

    // Reset
    m_OctOrLeadingZeroOnLastTKNumber = false;
    m_EscapeOnLastTkStrCon = FALSE;

    m_tempChBuf.Reset();

    // Use template parameter to gate raw string creation.
    // If createRawString is false, all these operations should be no-ops
    if (createRawString)
    {
        m_tempChBufSecondary.Reset();
    }

    for (;;)
    {
        switch ((rawch = ch = this->ReadFirst(p, last)))
        {
        case kchRET:
            if (stringTemplateMode)
            {
                if (this->PeekFirst(p, last) == kchNWL)
                {
                    // Eat the <LF> char, ignore return
                    this->ReadFirst(p, last);
                }

                // Both <CR> and <CR><LF> are normalized to <LF> in template cooked and raw values
                ch = rawch = kchNWL;
            }

            // Fall through
        case kchNWL:
            if (stringTemplateMode)
            {
                // Notify the scanner to update current line, number of lines etc
                NotifyScannedNewLine();

                // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                m_pchMinLine = p;

                break;
            }

            m_currentCharacter = p - 1;
            Error(ERRnoStrEnd);

        case '"':
        case '\'':
            if (ch == delim)
                goto LBreak;
            break;

        case '`':
            // In string template scan mode, don't consume the '`' - we need to differentiate
            // between a closed string template and the expression open sequence - ${
            if (stringTemplateMode)
            {
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case '$':
            // If we are parsing a string literal part of a string template, ${ indicates we need to switch
            // to parsing an expression.
            if (stringTemplateMode && this->PeekFirst(p, last) == '{')
            {
                // Rewind to the $ and return
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case kchNUL:
            if (p > last)
            {
                m_currentCharacter = p - 1;
                Error(ERRnoStrEnd);
            }
            break;

        default:
LMainDefault:
            if (this->IsMultiUnitChar(ch))
            {
                rawch = ch = this->template ReadRest<true>(ch, p, last);
            }
            break;

        case kchBSL:
            // In raw mode '\\' is not an escape character, just add the char into the raw buffer.
            m_tempChBufSecondary.template AppendCh<createRawString>(ch);

            m_EscapeOnLastTkStrCon=TRUE;

            // In raw mode, we append the raw char itself and not the escaped value so save the char.
            rawch = ch = this->ReadFirst(p, last);
            codepoint_t codePoint = 0;
            uint errorType = (uint)ERRbadHexDigit;
            switch (ch)
            {
            case 'b':
                ch = 0x08;
                break;
            case 't':
                ch = 0x09;
                break;
            case 'v':
                ch = 0x0B; //Only in ES5 mode
                break; //same as default
            case 'n':
                ch = 0x0A;
                break;
            case 'f':
                ch = 0x0C;
                break;
            case 'r':
                ch = 0x0D;
                break;
            case 'x':
                // Insert the 'x' here before jumping to parse the hex digits.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                // 2 hex digits
                ch = 0;
                goto LTwoHex;
            case 'u':
                // Raw string just inserts a 'u' here.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                ch = 0;
                if (Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto LFourHex;
                else if (c != '{' || !this->es6UnicodeMode)
                    goto ReturnScanError;

                Assert(c == '{');
                // c should definitely be a '{' which should be appended to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                //At least one digit is expected
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    goto ReturnScanError;
                }

                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint = static_cast<codepoint_t>(wT);

                while(Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    m_tempChBufSecondary.template AppendCh<createRawString>(c);
                    codePoint <<= 4;
                    codePoint += static_cast<codepoint_t>(wT);

                    if (codePoint > 0x10FFFF)
                    {
                        errorType = (uint)ERRInvalidCodePoint;
                        goto ReturnScanError;
                    }
                }

                if (c != '}')
                {
                    errorType = (uint)ERRMissingCurlyBrace;
                    goto ReturnScanError;
                }

                Assert(codePoint <= 0x10FFFF);

                if (codePoint >= 0x10000)
                {
                    OLECHAR lower = 0;
                    Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &ch);
                    m_tempChBuf.AppendCh(lower);
                }
                else
                {
                    ch = (char16)codePoint;
                }

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                break;
LFourHex:
                codePoint = 0x0;
                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x1000);
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append fourth (or second) hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0100);

LTwoHex:
                // This code path doesn't expect curly.
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0010);

                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                codePoint += static_cast<codepoint_t>(wT);

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                if (codePoint < 0x10000)
                {
                    ch = static_cast<OLECHAR>(codePoint);
                }
                else
                {
                    goto ReturnScanError;
                }
                break;
            case '0':
            case '1':
            case '2':
            case '3':
                // 1 to 3 octal digits

                ch -= '0';

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    c = this->PeekFirst(p, last);
                    if (ch != 0 || (c >= '0' && c <= '7'))
                    {
                        errorType = (uint)ERRES5NoOctal;
                        goto ReturnScanError;
                    }
                    break;
                }

                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    if (ch != 0 || ((char16)wT <= 9))
                    {
                        m_OctOrLeadingZeroOnLastTKNumber = true;
                    }
                    p--;
                    break;
                }

                m_OctOrLeadingZeroOnLastTKNumber = true;
                ch = static_cast< OLECHAR >(ch * 8 + wT);
                goto LOneOctal;
            case '4':
            case '5':
            case '6':
            case '7':
                // 1 to 2 octal digits

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    errorType = (uint)ERRES5NoOctal;
                    goto ReturnScanError;
                }

                ch -= '0';

                m_OctOrLeadingZeroOnLastTKNumber = true;

LOneOctal:
                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    p--;
                    break;
                }

                ch = static_cast< OLECHAR >(ch * 8 + wT);
                break;

            case kchRET:        // 0xD
                if (stringTemplateMode)
                {
                    // If this is \<CR><LF> we can eat the <LF> right now
                    if (this->PeekFirst(p, last) == kchNWL)
                    {
                        // Eat the <LF> char, ignore return
                        this->ReadFirst(p, last);
                    }

                    // Both \<CR> and \<CR><LF> are normalized to \<LF> in template raw string
                    rawch = kchNWL;
                }
            case kchLS:         // 0x2028, classifies as new line
            case kchPS:         // 0x2029, classifies as new line
            case kchNWL:        // 0xA
LEcmaEscapeLineBreak:
                if (stringTemplateMode)
                {
                    // We're going to ignore the line continuation tokens for the cooked strings, but we need to append the token for raw strings
                    m_tempChBufSecondary.template AppendCh<createRawString>(rawch);

                    // Template literal strings ignore all escaped line continuation tokens
                    NotifyScannedNewLine();

                    // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                    m_pchMinLine = p;

                    continue;
                }

                m_currentCharacter = p;
                ScanNewLine(ch);
                p = m_currentCharacter;
                continue;

            case 0:
                if (p >= last)
                {
                    errorType = (uint)ERRnoStrEnd;

ReturnScanError:
                    m_currentCharacter = p - 1;
                    Error(errorType);
                }
                else if (stringTemplateMode)
                {
                    // Escaped null character is translated into 0x0030 for raw template literals
                    rawch = 0x0030;
                }
                break;

            default:
                if (this->IsMultiUnitChar(ch))
                {
                    rawch = ch = this->template ReadRest<true>(ch, p, last);
                    switch (ch)
                    {
                    case kchLS:
                    case kchPS:
                        goto LEcmaEscapeLineBreak;
                    }
                }
                break;
            }
            break;
        }

        m_tempChBuf.AppendCh(ch);
        m_tempChBufSecondary.template AppendCh<createRawString>(rawch);
    }

LBreak:
    bool createPid = true;

    if ((m_DeferredParseFlags & ScanFlagSuppressStrPid) != 0)
    {
        createPid = false;

        if ((m_tempChBuf.m_ichCur == 10) && (0 == memcmp(_u("use strict"), m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur * sizeof(OLECHAR))))
        {
            createPid = true;
        }
    }

    if (createPid)
    {
        m_ptoken->SetIdentifier(this->GetHashTbl()->PidHashNameLen(m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur));
    }
    else
    {
        m_ptoken->SetIdentifier(NULL);
    }

    m_scanState = ScanStateNormal;
    m_doubleQuoteOnLastTkStrCon = '"' == delim;
    *pp = p;

    return tkStrCon;
}